

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O3

void __thiscall NaPNStatistics::print_stat(NaPNStatistics *this,char *szTitle,FILE *fp)

{
  NaVector *this_00;
  NaVector *this_01;
  NaReal NVar1;
  NaReal NVar2;
  NaReal NVar3;
  NaReal NVar4;
  double dVar5;
  double dVar6;
  NaReal NVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  NaReal *pNVar11;
  char *pcVar12;
  
  if (szTitle == (char *)0x0) {
    szTitle = NaPetriNode::name(&this->super_NaPetriNode);
    if (fp == (FILE *)0x0) {
      pcVar12 = "Statistics of node \'%s\':\n";
      goto LAB_00140ad4;
    }
    pcVar12 = "Statistics of node \'%s\':\n";
  }
  else {
    if (fp == (FILE *)0x0) {
      pcVar12 = "%s\n";
LAB_00140ad4:
      NaPrintLog(pcVar12,szTitle);
      NaPrintLog("       Min        Max         Mean     StdDev Dispersion        RMS Volume\n");
      bVar8 = true;
      goto LAB_00140aef;
    }
    pcVar12 = "%s\n";
  }
  fprintf((FILE *)fp,pcVar12,szTitle);
  fwrite("       Min        Max         Mean     StdDev Dispersion        RMS Volume\n",0x4b,1,
         (FILE *)fp);
  bVar8 = false;
LAB_00140aef:
  this_00 = &this->Mean;
  uVar9 = NaVector::dim(this_00);
  if (uVar9 != 0) {
    this_01 = &this->StdDev;
    uVar9 = 0;
    do {
      pNVar11 = NaVector::operator[](&this->Min,uVar9);
      NVar1 = *pNVar11;
      pNVar11 = NaVector::operator[](&this->Max,uVar9);
      NVar2 = *pNVar11;
      pNVar11 = NaVector::operator[](this_00,uVar9);
      NVar3 = *pNVar11;
      pNVar11 = NaVector::operator[](this_01,uVar9);
      NVar4 = *pNVar11;
      pNVar11 = NaVector::operator[](this_01,uVar9);
      dVar5 = *pNVar11;
      pNVar11 = NaVector::operator[](this_01,uVar9);
      dVar6 = *pNVar11;
      pNVar11 = NaVector::operator[](&this->RMS,uVar9);
      NVar7 = *pNVar11;
      uVar10 = NaPetriNode::activations(&this->super_NaPetriNode);
      if (bVar8) {
        NaPrintLog("%10g %10g %12g %10g %10g %10g %u\n",NVar1,NVar2,NVar3,NVar4,dVar5 * dVar6,NVar7,
                   (ulong)uVar10);
      }
      else {
        fprintf((FILE *)fp,"%10g %10g %12g %10g %10g %10g %u\n",NVar1,NVar2,NVar3,NVar4,
                dVar5 * dVar6,NVar7,(ulong)uVar10);
      }
      uVar9 = uVar9 + 1;
      uVar10 = NaVector::dim(this_00);
    } while (uVar9 < uVar10);
  }
  return;
}

Assistant:

void
NaPNStatistics::print_stat (const char* szTitle, FILE* fp)
{
    if(NULL == szTitle){
      if(NULL == fp)
        NaPrintLog("Statistics of node '%s':\n", name());
      else
        fprintf(fp, "Statistics of node '%s':\n", name());
    }else{
      if(NULL == fp)
        NaPrintLog("%s\n", szTitle);
      else
	fprintf(fp ,"%s\n", szTitle);
    }
    if(NULL == fp)
      NaPrintLog("       Min        Max         Mean     StdDev "	\
		 "Dispersion        RMS Volume\n");
    else
      fprintf(fp, "       Min        Max         Mean     StdDev "	\
	      "Dispersion        RMS Volume\n");
    for(unsigned i = 0; i < Mean.dim(); ++i){
      if(NULL == fp)
	NaPrintLog("%10g %10g %12g %10g %10g %10g %u\n",
		   Min[i], Max[i], Mean[i], StdDev[i], StdDev[i]*StdDev[i],
		   RMS[i], activations());
      else
	fprintf(fp, "%10g %10g %12g %10g %10g %10g %u\n",
		Min[i], Max[i], Mean[i], StdDev[i], StdDev[i]*StdDev[i],
		RMS[i], activations());
    }
}